

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bgzf.c
# Opt level: O3

int bgzf_index_add_block(BGZF *fp)

{
  bgzidx1_t *pbVar1;
  bgzidx_t *pbVar2;
  uint uVar3;
  int iVar4;
  
  pbVar2 = fp->idx;
  uVar3 = pbVar2->noffs;
  iVar4 = uVar3 + 1;
  pbVar2->noffs = iVar4;
  if ((int)uVar3 < pbVar2->moffs) {
    pbVar1 = pbVar2->offs;
  }
  else {
    uVar3 = (int)uVar3 >> 1 | uVar3;
    uVar3 = (int)uVar3 >> 2 | uVar3;
    uVar3 = (int)uVar3 >> 4 | uVar3;
    uVar3 = (int)uVar3 >> 8 | uVar3;
    uVar3 = (int)uVar3 >> 0x10 | uVar3;
    pbVar2->moffs = uVar3 + 1;
    pbVar1 = (bgzidx1_t *)realloc(pbVar2->offs,(long)(int)uVar3 * 0x10 + 0x10);
    pbVar2 = fp->idx;
    pbVar2->offs = pbVar1;
    if (pbVar1 == (bgzidx1_t *)0x0) {
      return -1;
    }
    iVar4 = pbVar2->noffs;
  }
  pbVar1[(long)iVar4 + -1].uaddr = pbVar2->ublock_addr;
  pbVar1[(long)iVar4 + -1].caddr = fp->block_address;
  return 0;
}

Assistant:

int bgzf_index_add_block(BGZF *fp)
{
    fp->idx->noffs++;
    if ( fp->idx->noffs > fp->idx->moffs )
    {
        fp->idx->moffs = fp->idx->noffs;
        kroundup32(fp->idx->moffs);
        fp->idx->offs = (bgzidx1_t*) realloc(fp->idx->offs, fp->idx->moffs*sizeof(bgzidx1_t));
        if ( !fp->idx->offs ) return -1;
    }
    fp->idx->offs[ fp->idx->noffs-1 ].uaddr = fp->idx->ublock_addr;
    fp->idx->offs[ fp->idx->noffs-1 ].caddr = fp->block_address;
    return 0;
}